

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall cmMakefile::GetDef(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  bool bVar2;
  string *psVar3;
  pointer newValue;
  cmVariableWatch *this_00;
  
  psVar3 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  if (psVar3 == (string *)0x0) {
    psVar3 = cmState::GetInitializedCacheValue
                       ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if (pcVar1 == (cmake *)0x0) {
    this_00 = (cmVariableWatch *)0x0;
  }
  else {
    this_00 = (pcVar1->VariableWatch)._M_t.
              super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
              super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
              super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl;
  }
  if ((this_00 != (cmVariableWatch *)0x0) && (this->SuppressSideEffects == false)) {
    if (psVar3 == (string *)0x0) {
      newValue = (char *)0x0;
    }
    else {
      newValue = (psVar3->_M_dataplus)._M_p;
    }
    bVar2 = cmVariableWatch::VariableAccessed
                      (this_00,name,(uint)(psVar3 == (string *)0x0),newValue,this);
    if (bVar2) {
      psVar3 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      if (psVar3 == (string *)0x0) {
        psVar3 = cmState::GetInitializedCacheValue
                           ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
        return psVar3;
      }
    }
  }
  return psVar3;
}

Assistant:

const std::string* cmMakefile::GetDef(const std::string& name) const
{
  const std::string* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv && !this->SuppressSideEffects) {
    bool const watch_function_executed =
      vv->VariableAccessed(name,
                           def ? cmVariableWatch::VARIABLE_READ_ACCESS
                               : cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS,
                           (def ? def->c_str() : nullptr), this);

    if (watch_function_executed) {
      // A callback was executed and may have caused re-allocation of the
      // variable storage.  Look it up again for now.
      // FIXME: Refactor variable storage to avoid this problem.
      def = this->StateSnapshot.GetDefinition(name);
      if (!def) {
        def = this->GetState()->GetInitializedCacheValue(name);
      }
    }
  }
#endif
  return def;
}